

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void MatrixDisplay(Matrix_t sMatrix)

{
  uint uVar1;
  float *pfVar2;
  ulong uVar3;
  ulong uVar4;
  
  pfVar2 = sMatrix.pMatrix;
  uVar1 = sMatrix._9_4_ & 0xff;
  printf("ROW:%d,COLUMN:%d\n",(ulong)(sMatrix._8_4_ & 0xff));
  if (((undefined1  [16])sMatrix & (undefined1  [16])0xff) != (undefined1  [16])0x0) {
    uVar3 = 0;
    do {
      if (((undefined1  [16])sMatrix & (undefined1  [16])0xff00) != (undefined1  [16])0x0) {
        uVar4 = 0;
        do {
          printf("\t%f",(double)pfVar2[uVar4]);
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
      putchar(10);
      uVar3 = uVar3 + 1;
      pfVar2 = (float *)((long)pfVar2 + (ulong)(uVar1 * 4));
    } while (uVar3 != (sMatrix._8_8_ & 0xff));
  }
  return;
}

Assistant:

void MatrixDisplay(Matrix_t sMatrix)
{
	int i, j;
	printf("ROW:%d,COLUMN:%d\n", sMatrix.row, sMatrix.column);
	for (i = 0; i < sMatrix.row; i++)
	{
		for (j = 0; j < sMatrix.column; j++)
			printf("\t%f", *(sMatrix.pMatrix + i * sMatrix.column + j));
		printf("\n");
	}
}